

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

QDomAttrPrivate * __thiscall
QDomElementPrivate::setAttributeNode(QDomElementPrivate *this,QDomAttrPrivate *newAttr)

{
  QDomNodePrivate *in_RSI;
  QDomNodePrivate *in_RDI;
  long in_FS_OFFSET;
  QDomNodePrivate *foundAttr;
  QDomNodePrivate *in_stack_ffffffffffffff78;
  Data *name;
  QDomNamedNodeMapPrivate *in_stack_ffffffffffffff98;
  QDomNodePrivate *this_00;
  QDomNodePrivate *local_40;
  QDomNodePrivate *arg;
  
  arg = *(QDomNodePrivate **)(in_FS_OFFSET + 0x28);
  if (in_RSI == (QDomNodePrivate *)0x0) {
    local_40 = (QDomNodePrivate *)0x0;
  }
  else {
    name = (Data *)in_RDI[1]._vptr_QDomNodePrivate;
    QDomNodePrivate::nodeName(in_stack_ffffffffffffff78);
    local_40 = QDomNamedNodeMapPrivate::namedItem(in_stack_ffffffffffffff98,(QString *)name);
    QString::~QString((QString *)0x1162a4);
    if (local_40 != (QDomNodePrivate *)0x0) {
      this_00 = local_40;
      QDomNodePrivate::nodeName(in_stack_ffffffffffffff78);
      QDomNamedNodeMapPrivate::removeNamedItem((QDomNamedNodeMapPrivate *)this_00,(QString *)name);
      QString::~QString((QString *)0x1162ef);
    }
    QDomNamedNodeMapPrivate::setNamedItem((QDomNamedNodeMapPrivate *)in_RDI,arg);
    QDomNodePrivate::setParent(in_RSI,in_RDI);
  }
  if (*(QDomNodePrivate **)(in_FS_OFFSET + 0x28) == arg) {
    return (QDomAttrPrivate *)local_40;
  }
  __stack_chk_fail();
}

Assistant:

QDomAttrPrivate* QDomElementPrivate::setAttributeNode(QDomAttrPrivate* newAttr)
{
    if (!newAttr)
        return nullptr;

    QDomNodePrivate* foundAttr = m_attr->namedItem(newAttr->nodeName());
    if (foundAttr)
        m_attr->removeNamedItem(newAttr->nodeName());

    // Referencing is done by the maps
    m_attr->setNamedItem(newAttr);
    newAttr->setParent(this);

    return static_cast<QDomAttrPrivate *>(foundAttr);
}